

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSettingsHandler_ClearAll
               (ImGuiContext_conflict *ctx,ImGuiSettingsHandler_conflict *param_2)

{
  ImGuiDockContext *dc;
  ImGuiSettingsHandler_conflict *param_1_local;
  ImGuiContext_conflict *ctx_local;
  
  ImVector<ImGuiDockNodeSettings>::clear(&(ctx->DockContext).NodesSettings);
  DockContextClearNodes(ctx,0,true);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    dc->NodesSettings.clear();
    DockContextClearNodes(ctx, 0, true);
}